

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<flatbuffers::Offset<void>,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,Array<flatbuffers::Offset<void>,_(unsigned_short)65535> *param_2,
          ushort param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint8_t *local_80;
  char *err;
  void *ptr;
  unsigned_short i;
  int elem_indent;
  bool is_struct;
  uint8_t *prev_val_local;
  int indent_local;
  Type *type_local;
  unsigned_short size_local;
  Array<flatbuffers::Offset<void>,_(unsigned_short)65535> *c_local;
  JsonPrinter *this_local;
  
  bVar1 = IsStruct(param_4);
  iVar2 = Indent(this);
  std::__cxx11::string::operator+=((string *)this->text,'[');
  AddNewLine(this);
  ptr._6_2_ = 0;
  while( true ) {
    if (param_3 <= ptr._6_2_) {
      AddNewLine(this);
      AddIndent(this,param_5);
      std::__cxx11::string::operator+=((string *)this->text,']');
      return (char *)0x0;
    }
    if (ptr._6_2_ != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,param_5 + iVar2);
    if (bVar1) {
      local_80 = Array<flatbuffers::Offset<void>,_(unsigned_short)65535>::Data(param_2);
      local_80 = local_80 + param_4->struct_def->bytesize * (ulong)ptr._6_2_;
    }
    else {
      local_80 = (uint8_t *)
                 Array<flatbuffers::Offset<void>,_(unsigned_short)65535>::operator[]
                           (param_2,(uint)ptr._6_2_);
    }
    pcVar3 = PrintOffset(this,local_80,param_4,param_5 + iVar2,param_6,(uint)ptr._6_2_);
    if (pcVar3 != (char *)0x0) break;
    ptr._6_2_ = ptr._6_2_ + 1;
  }
  return pcVar3;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }